

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

int __thiscall Widget_Browser::handle(Widget_Browser *this,int e)

{
  int iVar1;
  Fl_Type *pFVar2;
  Fl_Type *pFVar3;
  long *plVar4;
  Fl_Type *pFVar5;
  int X;
  int H;
  int W;
  int Y;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  Fl_Browser_::bbox(&this->super_Fl_Browser_,&local_30,&local_24,&local_28,&local_2c);
  pFVar2 = pushedtitle;
  if (e != 5) {
    if (e == 2) {
      if (handle::title != (Fl_Type *)0x0) {
        pushedtitle = (Fl_Type *)0x0;
        handle::title = (Fl_Type *)0x0;
        if (pFVar2 == (Fl_Type *)0x0) {
          pushedtitle = (Fl_Type *)0x0;
          handle::title = (Fl_Type *)0x0;
          return 1;
        }
        if (pFVar2->open_ == '\0') {
          pFVar2->open_ = '\x01';
          pFVar3 = pFVar2->next;
          if (pFVar2->next != (Fl_Type *)0x0) {
            while (pFVar2->level < pFVar3->level) {
              pFVar3->visible = '\x01';
              iVar1 = (*pFVar3->_vptr_Fl_Type[0x16])(pFVar3);
              if ((iVar1 == 0) || (pFVar5 = pFVar3, pFVar3->open_ != '\0')) {
                pFVar5 = pFVar3->next;
              }
              else {
                do {
                  pFVar5 = pFVar5->next;
                  if (pFVar5 == (Fl_Type *)0x0) goto LAB_00180b02;
                } while (pFVar3->level < pFVar5->level);
              }
              pFVar3 = pFVar5;
              if (pFVar5 == (Fl_Type *)0x0) break;
            }
          }
        }
        else {
          pFVar2->open_ = '\0';
          pFVar3 = pFVar2->next;
          if (pFVar3 != (Fl_Type *)0x0) {
            iVar1 = pFVar2->level;
            do {
              if (pFVar3->level <= iVar1) break;
              pFVar3->visible = '\0';
              pFVar3 = pFVar3->next;
            } while (pFVar3 != (Fl_Type *)0x0);
          }
        }
LAB_00180b02:
        Fl_Widget::redraw((Fl_Widget *)this);
        return 1;
      }
      plVar4 = (long *)Fl_Browser_::find_item(&this->super_Fl_Browser_,Fl::e_y);
      if (((plVar4 != (long *)0x0) && ((char)plVar4[8] != '\0')) &&
         ((Fl::e_clicks != 0 || ((Fl::e_state._2_1_ & 4) != 0)))) {
        (**(code **)(*plVar4 + 0x58))(plVar4);
      }
    }
    else if (((e == 1) &&
             (iVar1 = Fl::event_inside(local_30,local_24,local_28,local_2c), iVar1 != 0)) &&
            (pFVar2 = (Fl_Type *)Fl_Browser_::find_item(&this->super_Fl_Browser_,Fl::e_y),
            pFVar2 != (Fl_Type *)0x0)) {
      local_30 = local_30 + ((pFVar2->level * 0xc + 3) - (this->super_Fl_Browser_).hposition_);
      iVar1 = (*pFVar2->_vptr_Fl_Type[0x16])(pFVar2);
      if ((iVar1 != 0) && (Fl::e_x < local_30 + 0xd && local_30 < Fl::e_x)) {
        pushedtitle = pFVar2;
        handle::title = pFVar2;
        Fl_Browser_::redraw_line(&this->super_Fl_Browser_,pFVar2);
        return 1;
      }
    }
LAB_00180a90:
    iVar1 = Fl_Browser_::handle(&this->super_Fl_Browser_,e);
    return iVar1;
  }
  if (handle::title == (Fl_Type *)0x0) goto LAB_00180a90;
  pFVar2 = (Fl_Type *)Fl_Browser_::find_item(&this->super_Fl_Browser_,Fl::e_y);
  if (pFVar2 != (Fl_Type *)0x0) {
    local_30 = local_30 + ((pFVar2->level * 0xc + 3) - (this->super_Fl_Browser_).hposition_);
    iVar1 = (*pFVar2->_vptr_Fl_Type[0x16])(pFVar2);
    if ((iVar1 != 0) && (local_30 < Fl::e_x && Fl::e_x < local_30 + 0xd)) goto LAB_00180a1b;
  }
  pFVar2 = (Fl_Type *)0x0;
LAB_00180a1b:
  if (pFVar2 == pushedtitle) {
    return 1;
  }
  if (pushedtitle != (Fl_Type *)0x0) {
    Fl_Browser_::redraw_line(&this->super_Fl_Browser_,pushedtitle);
  }
  if (pFVar2 == (Fl_Type *)0x0) {
    pushedtitle = pFVar2;
    return 1;
  }
  Fl_Browser_::redraw_line(&this->super_Fl_Browser_,pFVar2);
  pushedtitle = pFVar2;
  return 1;
}

Assistant:

int Widget_Browser::handle(int e) {
  static Fl_Type *title;
  Fl_Type *l;
  int X,Y,W,H; bbox(X,Y,W,H);
  switch (e) {
  case FL_PUSH:
    if (!Fl::event_inside(X,Y,W,H)) break;
    l = (Fl_Type*)find_item(Fl::event_y());
    if (l) {
      X += 3 + 12*l->level - hposition();
      if (l->is_parent() && Fl::event_x()>X && Fl::event_x()<X+13) {
	title = pushedtitle = l;
	redraw_line(l);
	return 1;
      }
    }
    break;
  case FL_DRAG:
    if (!title) break;
    l = (Fl_Type*)find_item(Fl::event_y());
    if (l) {
      X += 3 + 12*l->level - hposition();
      if (l->is_parent() && Fl::event_x()>X && Fl::event_x()<X+13) ;
      else l = 0;
    }
    if (l != pushedtitle) {
      if (pushedtitle) redraw_line(pushedtitle);
      if (l) redraw_line(l);
      pushedtitle = l;
    }
    return 1;
  case FL_RELEASE:
    if (!title) {
      l = (Fl_Type*)find_item(Fl::event_y());
      if (l && l->new_selected && (Fl::event_clicks() || Fl::event_state(FL_CTRL)))
	l->open();
      break;
    }
    l = pushedtitle;
    title = pushedtitle = 0;
    if (l) {
      if (l->open_) {
	l->open_ = 0;
	for (Fl_Type*k = l->next; k&&k->level>l->level; k = k->next)
	  k->visible = 0;
      } else {
	l->open_ = 1;
	for (Fl_Type*k=l->next; k&&k->level>l->level;) {
	  k->visible = 1;
	  if (k->is_parent() && !k->open_) {
	    Fl_Type *j;
	    for (j = k->next; j && j->level>k->level; j = j->next) {/*empty*/}
	    k = j;
	  } else
	    k = k->next;
	}
      }
      redraw();
    }
    return 1;
  }
  return Fl_Browser_::handle(e);
}